

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O2

void __thiscall input_mod::input_mod(input_mod *this,DUH *myduh)

{
  int iVar1;
  undefined4 extraout_var;
  uint uVar2;
  float extraout_XMM0_Da;
  
  StreamSong::StreamSong(&this->super_StreamSong);
  (this->super_StreamSong).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__input_mod_006ea428;
  (this->Codec).Chars = FString::NullString.Nothing;
  (this->TrackerVersion).Chars = FString::NullString.Nothing;
  (this->FormatVersion).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 3;
  FCriticalSection::FCriticalSection(&this->crit_sec);
  this->duh = myduh;
  this->sr = (DUH_SIGRENDERER *)0x0;
  this->eof = false;
  this->interp = mod_interp.Value;
  this->volramp = mod_volramp.Value;
  this->written = 0;
  this->length = 0.0;
  this->start_order = 0;
  uVar2 = mod_samplerate.Value;
  if (mod_samplerate.Value == 0) {
    (*GSnd->_vptr_SoundRenderer[10])();
    uVar2 = (uint)extraout_XMM0_Da;
  }
  this->srate = uVar2;
  iVar1 = (*GSnd->_vptr_SoundRenderer[0xb])(GSnd,read,0x8000,8,(ulong)uVar2,this);
  (this->super_StreamSong).m_Stream = (SoundStream *)CONCAT44(extraout_var,iVar1);
  this->delta = 65536.0 / (double)this->srate;
  return;
}

Assistant:

input_mod::input_mod(DUH *myduh)
{
	duh = myduh;
	sr = NULL;
	eof = false;
	interp = mod_interp;
	volramp = mod_volramp;
	written = 0;
	length = 0;
	start_order = 0;
	if (mod_samplerate != 0)
	{
		srate = mod_samplerate;
	}
	else
	{
		srate = (int)GSnd->GetOutputRate();
	}
	m_Stream = GSnd->CreateStream(read, 32*1024, SoundStream::Float, srate, this);
	delta = 65536.0 / srate;
}